

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O1

void ParsePrevouts(UniValue *prevTxsUnival,FlatSigningProvider *keystore,
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  *coins)

{
  size_t __n;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  UniValue *pUVar6;
  UniValue *pUVar7;
  UniValue *pUVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  string *psVar11;
  string *psVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  char *pcVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  CScript *pCVar17;
  long *plVar18;
  size_t index;
  UniValue *v;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view key;
  string_view key_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l_00;
  string_view key_01;
  string_view key_02;
  string_view strKey;
  string_view strKey_00;
  string_view name;
  string_view name_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CTxDestination p2sh_p2wsh;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scriptData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> redeemScriptData;
  CScript witness_output_script;
  size_t i;
  CScript scriptPubKey;
  COutPoint out;
  Coin newcoin;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210;
  undefined1 local_1f8 [72];
  __index_type local_1b0;
  string local_1a8;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  direct_or_indirect local_128;
  uint local_10c;
  key_type local_108;
  uint256 local_d8;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [32];
  string local_90 [16];
  long local_80 [2];
  undefined8 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (prevTxsUnival->typ != VNULL) {
    pUVar6 = UniValue::get_array(prevTxsUnival);
    if ((pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index = 0;
      do {
        pUVar7 = UniValue::operator[](pUVar6,index);
        if (pUVar7->typ != VOBJ) {
          pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
          local_b8 = (undefined1  [8])(auStack_b0 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,
                     "expected object with {\"txid\'\",\"vout\",\"scriptPubKey\"}","");
          JSONRPCError(pUVar6,-0x16,(string *)local_b8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00daaf41;
        }
        pUVar7 = UniValue::get_obj(pUVar7);
        local_b8 = (undefined1  [8])(auStack_b0 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"txid","");
        auStack_b0._24_4_ = 0;
        auStack_b0._28_4_ = VSTR;
        local_90._0_8_ = local_80;
        std::__cxx11::string::_M_construct<char_const*>(local_90,"vout","");
        local_70._0_1_ = '\0';
        local_70._1_7_ = 0x4000000;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"scriptPubKey","");
        local_48 = 0x300000000;
        __l._M_len = 3;
        __l._M_array = (iterator)local_b8;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
               *)local_1f8,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_108,(allocator_type *)&local_d8);
        RPCTypeCheckObj(pUVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                                *)local_1f8,false,false);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                     *)local_1f8);
        lVar19 = -0x78;
        plVar18 = local_58;
        do {
          if (plVar18 != (long *)plVar18[-2]) {
            operator_delete((long *)plVar18[-2],*plVar18 + 1);
          }
          plVar18 = plVar18 + -5;
          lVar19 = lVar19 + 0x28;
        } while (lVar19 != 0);
        strKey._M_str = "txid";
        strKey._M_len = 4;
        ParseHashO(&local_d8,pUVar7,strKey);
        key._M_str = "vout";
        key._M_len = 4;
        pUVar8 = UniValue::find_value(pUVar7,key);
        uVar4 = UniValue::getInt<int>(pUVar8);
        if ((int)uVar4 < 0) {
          pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
          local_b8 = (undefined1  [8])(auStack_b0 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"vout cannot be negative","");
          JSONRPCError(pUVar6,-0x16,(string *)local_b8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00daaf41;
        }
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x10];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x11];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x12];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x13];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x14];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x15];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x16];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x17];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x18];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x19];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
             local_d8.super_base_blob<256U>.m_data._M_elems[1];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
             local_d8.super_base_blob<256U>.m_data._M_elems[2];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
             local_d8.super_base_blob<256U>.m_data._M_elems[3];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
             local_d8.super_base_blob<256U>.m_data._M_elems[4];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
             local_d8.super_base_blob<256U>.m_data._M_elems[5];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
             local_d8.super_base_blob<256U>.m_data._M_elems[6];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
             local_d8.super_base_blob<256U>.m_data._M_elems[7];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
             local_d8.super_base_blob<256U>.m_data._M_elems[8];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
             local_d8.super_base_blob<256U>.m_data._M_elems[9];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             local_d8.super_base_blob<256U>.m_data._M_elems[10];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0xb];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0xc];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0xd];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0xe];
        local_108.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             local_d8.super_base_blob<256U>.m_data._M_elems[0xf];
        strKey_00._M_str = "scriptPubKey";
        strKey_00._M_len = 0xc;
        local_108.n = uVar4;
        ParseHexO(&local_210,pUVar7,strKey_00);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        iVar9 = std::
                _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                ::find(&coins->_M_t,&local_108);
        if (((_Rb_tree_header *)iVar9._M_node != &(coins->_M_t)._M_impl.super__Rb_tree_header) &&
           (iVar9._M_node[2]._M_parent != (_Base_ptr)0xffffffffffffffff)) {
          bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             &iVar9._M_node[2]._M_left,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             &local_128.indirect_contents);
          if (!bVar2) {
            local_b8 = (undefined1  [8])(auStack_b0 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"Previous output scriptPubKey mismatch:\n","");
            ScriptToAsmStr_abi_cxx11_
                      ((string *)local_188,(CScript *)&iVar9._M_node[2]._M_left,false);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_188);
            pbVar14 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_168,"\nvs:\n");
            local_148._0_8_ = (pbVar14->_M_dataplus)._M_p;
            paVar16 = &pbVar14->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._0_8_ == paVar16) {
              local_148._16_8_ = paVar16->_M_allocated_capacity;
              local_148._24_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
              local_148._0_8_ = local_148 + 0x10;
            }
            else {
              local_148._16_8_ = paVar16->_M_allocated_capacity;
            }
            local_148._8_8_ = pbVar14->_M_string_length;
            (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar14->_M_string_length = 0;
            (pbVar14->field_2)._M_local_buf[0] = '\0';
            ScriptToAsmStr_abi_cxx11_(&local_1a8,(CScript *)&local_128.indirect_contents,false);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,&local_1a8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
                     );
            if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
              operator_delete((void *)local_1f8._0_8_,
                              CONCAT44(local_1f8._20_4_,local_1f8._16_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
              operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
            }
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_,
                              CONCAT44(local_188._20_4_,local_188._16_4_) + 1);
            }
            pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
            JSONRPCError(pUVar6,-0x16,(string *)local_b8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00daaf41;
          }
        }
        CTxOut::CTxOut((CTxOut *)local_b8);
        local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents)
        ;
        local_b8 = (undefined1  [8])0x775f05a074000;
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"amount","");
        bVar2 = UniValue::findKey(pUVar7,(string *)local_1f8,(size_t *)local_148);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,CONCAT44(local_1f8._20_4_,local_1f8._16_4_) + 1);
        }
        if (bVar2) {
          key_00._M_str = "amount";
          key_00._M_len = 6;
          pUVar8 = UniValue::find_value(pUVar7,key_00);
          local_b8 = (undefined1  [8])AmountFromValue(pUVar8,8);
        }
        local_90._0_8_ = local_90._0_8_ & 0xffffffff00000001 | 2;
        pmVar10 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::operator[](coins,&local_108);
        (pmVar10->out).nValue = (CAmount)local_b8;
        pCVar17 = &(pmVar10->out).scriptPubKey;
        if (0x1c < (pmVar10->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar17->super_CScriptBase)._union.indirect_contents.indirect);
        }
        uVar1 = local_90._0_8_;
        *(ulong *)((long)&(pmVar10->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT44(auStack_b0._16_4_,auStack_b0._12_4_);
        *(ulong *)((long)&(pmVar10->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(auStack_b0._24_4_,auStack_b0._20_4_);
        (pCVar17->super_CScriptBase)._union.indirect_contents.indirect = (char *)auStack_b0._0_8_;
        *(ulong *)((long)&(pmVar10->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT44(auStack_b0._12_4_,auStack_b0._8_4_);
        (pmVar10->out).scriptPubKey.super_CScriptBase._size = auStack_b0._28_4_;
        auStack_b0._28_4_ = VNULL;
        pmVar10->field_0x28 = local_90[0];
        pmVar10->field_0x29 = local_90[1];
        pmVar10->field_0x2a = local_90[2];
        pmVar10->field_0x2b = local_90[3];
        local_90._0_8_ = uVar1;
        bVar2 = CScript::IsPayToScriptHash((CScript *)&local_128.indirect_contents);
        bVar3 = CScript::IsPayToWitnessScriptHash((CScript *)&local_128.indirect_contents);
        if ((bVar2 || bVar3) && keystore != (FlatSigningProvider *)0x0) {
          local_b8 = (undefined1  [8])(auStack_b0 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"redeemScript","");
          auStack_b0._24_4_ = 0;
          auStack_b0._28_4_ = VSTR;
          local_90._0_8_ = local_80;
          std::__cxx11::string::_M_construct<char_const*>(local_90,"witnessScript","");
          local_70._0_1_ = '\0';
          local_70._1_7_ = 0x3000000;
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)local_b8;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                 *)local_1f8,__l_00,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_148,(allocator_type *)local_168);
          RPCTypeCheckObj(pUVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                                  *)local_1f8,true,false);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                       *)local_1f8);
          lVar19 = -0x50;
          plVar18 = local_80;
          do {
            if (plVar18 != (long *)plVar18[-2]) {
              operator_delete((long *)plVar18[-2],*plVar18 + 1);
            }
            plVar18 = plVar18 + -5;
            lVar19 = lVar19 + 0x28;
          } while (lVar19 != 0);
          key_01._M_str = "redeemScript";
          key_01._M_len = 0xc;
          pUVar8 = UniValue::find_value(pUVar7,key_01);
          key_02._M_str = "witnessScript";
          key_02._M_len = 0xd;
          pUVar7 = UniValue::find_value(pUVar7,key_02);
          if (pUVar7->typ == VNULL && pUVar8->typ == VNULL) {
            pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
            local_b8 = (undefined1  [8])(auStack_b0 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"Missing redeemScript/witnessScript","");
            JSONRPCError(pUVar6,-8,(string *)local_b8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00daaf41;
          }
          bVar20 = pUVar7->typ == VNULL;
          v = pUVar7;
          if (bVar20) {
            v = pUVar8;
          }
          pcVar15 = "witnessScript";
          if (bVar20) {
            pcVar15 = "redeemScript";
          }
          name._M_len = (ulong)bVar20 ^ 0xd;
          name._M_str = pcVar15;
          ParseHexV((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,v,name);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_1a8._M_dataplus._M_p,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_1a8._M_string_length);
          CScriptID::CScriptID((CScriptID *)local_b8,(CScript *)local_148);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&keystore->scripts,(CScriptID *)local_b8,(CScript *)local_148);
          WitnessV0ScriptHash::WitnessV0ScriptHash
                    ((WitnessV0ScriptHash *)local_1f8,(CScript *)local_148);
          auStack_b0._8_4_ = local_1f8._16_4_;
          auStack_b0._12_4_ = local_1f8._20_4_;
          auStack_b0._16_4_ = local_1f8._24_4_;
          auStack_b0._20_4_ = local_1f8._28_4_;
          local_b8 = (undefined1  [8])local_1f8._0_8_;
          auStack_b0._0_8_ = local_1f8._8_8_;
          local_70._0_1_ = '\x04';
          GetScriptForDestination((CScript *)local_168,(CTxDestination *)local_b8);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_b8);
          CScriptID::CScriptID((CScriptID *)local_b8,(CScript *)local_168);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&keystore->scripts,(CScriptID *)local_b8,(CScript *)local_168);
          if ((pUVar7->typ != VNULL) && (pUVar8->typ != VNULL)) {
            psVar11 = UniValue::get_str_abi_cxx11_(pUVar7);
            psVar12 = UniValue::get_str_abi_cxx11_(pUVar8);
            __n = psVar11->_M_string_length;
            if (__n == psVar12->_M_string_length) {
              if (__n != 0) {
                iVar5 = bcmp((psVar11->_M_dataplus)._M_p,(psVar12->_M_dataplus)._M_p,__n);
                if (iVar5 != 0) goto LAB_00daa0aa;
              }
            }
            else {
LAB_00daa0aa:
              name_00._M_str = "redeemScript";
              name_00._M_len = 0xc;
              ParseHexV((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,pUVar8,
                        name_00);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::
              prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_188._0_8_,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_188._8_8_);
              bVar20 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                 ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8,
                                  (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
              if (!bVar20) {
                pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
                local_1f8._0_8_ = local_1f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1f8,"redeemScript does not correspond to witnessScript",
                           "");
                JSONRPCError(pUVar6,-8,(string *)local_1f8);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
                }
                goto LAB_00daaf41;
              }
              if (0x1c < (uint)auStack_b0._20_4_) {
                free((void *)local_b8);
                local_b8 = (undefined1  [8])0x0;
              }
              if ((uchar *)local_188._0_8_ != (uchar *)0x0) {
                operator_delete((void *)local_188._0_8_,
                                CONCAT44(local_188._20_4_,local_188._16_4_) - local_188._0_8_);
              }
            }
          }
          if (bVar2) {
            ScriptHash::ScriptHash((ScriptHash *)local_1f8,(CScript *)local_148);
            auStack_b0._8_4_ = local_1f8._16_4_;
            local_b8 = (undefined1  [8])local_1f8._0_8_;
            auStack_b0._0_8_ = local_1f8._8_8_;
            local_70._0_1_ = '\x03';
            ScriptHash::ScriptHash((ScriptHash *)local_188,(CScript *)local_168);
            local_1f8._16_4_ = local_188._16_4_;
            local_1f8._0_8_ = local_188._0_8_;
            local_1f8._8_8_ = local_188._8_8_;
            local_1b0 = '\x03';
            GetScriptForDestination((CScript *)local_188,(CTxDestination *)local_b8);
            bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               &local_128.indirect_contents,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
            if (0x1c < (uint)local_188._28_4_) {
              free((void *)local_188._0_8_);
              local_188._0_8_ = (uchar *)0x0;
            }
            if (!bVar2) {
              GetScriptForDestination((CScript *)local_188,(CTxDestination *)local_1f8);
              bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 &local_128.indirect_contents,
                                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
              if (0x1c < (uint)local_188._28_4_) {
                free((void *)local_188._0_8_);
                local_188._0_8_ = (uchar *)0x0;
              }
              if (!bVar2) {
                pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
                local_188._0_8_ = local_188 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_188,
                           "redeemScript/witnessScript does not match scriptPubKey","");
                JSONRPCError(pUVar6,-8,(string *)local_188);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
                }
                goto LAB_00daaf41;
              }
            }
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_1f8);
LAB_00daa2ce:
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_b8);
          }
          else if (bVar3) {
            WitnessV0ScriptHash::WitnessV0ScriptHash
                      ((WitnessV0ScriptHash *)local_1f8,(CScript *)local_148);
            auStack_b0._8_4_ = local_1f8._16_4_;
            auStack_b0._12_4_ = local_1f8._20_4_;
            auStack_b0._16_4_ = local_1f8._24_4_;
            auStack_b0._20_4_ = local_1f8._28_4_;
            local_b8 = (undefined1  [8])local_1f8._0_8_;
            auStack_b0._0_8_ = local_1f8._8_8_;
            local_70._0_1_ = '\x04';
            GetScriptForDestination((CScript *)local_1f8,(CTxDestination *)local_b8);
            bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               &local_128.indirect_contents,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8);
            if (0x1c < (uint)local_1f8._28_4_) {
              free((void *)local_1f8._0_8_);
              local_1f8._0_8_ = (uchar *)0x0;
            }
            if (bVar2) goto LAB_00daa2ce;
            pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
            local_1f8._0_8_ = local_1f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"redeemScript/witnessScript does not match scriptPubKey",
                       "");
            JSONRPCError(pUVar6,-8,(string *)local_1f8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00daaf41;
          }
          if (0x1c < (uint)local_168._28_4_) {
            free((void *)local_168._0_8_);
            local_168._0_8_ = (char *)0x0;
          }
          if (0x1c < (uint)local_148._28_4_) {
            free((void *)local_148._0_8_);
            local_148._0_8_ = (pointer)0x0;
          }
          if ((uchar *)local_1a8._M_dataplus._M_p != (uchar *)0x0) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            local_1a8.field_2._M_allocated_capacity -
                            (long)local_1a8._M_dataplus._M_p);
          }
        }
        if (0x1c < local_10c) {
          free(local_128.indirect_contents.indirect);
          local_128.indirect_contents.indirect = (char *)0x0;
        }
        if (local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_210.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_210.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_210.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        index = (size_t)((int)index + 1);
        uVar13 = ((long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      } while (index <= uVar13 && uVar13 - index != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00daaf41:
  __stack_chk_fail();
}

Assistant:

void ParsePrevouts(const UniValue& prevTxsUnival, FlatSigningProvider* keystore, std::map<COutPoint, Coin>& coins)
{
    if (!prevTxsUnival.isNull()) {
        const UniValue& prevTxs = prevTxsUnival.get_array();
        for (unsigned int idx = 0; idx < prevTxs.size(); ++idx) {
            const UniValue& p = prevTxs[idx];
            if (!p.isObject()) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "expected object with {\"txid'\",\"vout\",\"scriptPubKey\"}");
            }

            const UniValue& prevOut = p.get_obj();

            RPCTypeCheckObj(prevOut,
                {
                    {"txid", UniValueType(UniValue::VSTR)},
                    {"vout", UniValueType(UniValue::VNUM)},
                    {"scriptPubKey", UniValueType(UniValue::VSTR)},
                });

            Txid txid = Txid::FromUint256(ParseHashO(prevOut, "txid"));

            int nOut = prevOut.find_value("vout").getInt<int>();
            if (nOut < 0) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "vout cannot be negative");
            }

            COutPoint out(txid, nOut);
            std::vector<unsigned char> pkData(ParseHexO(prevOut, "scriptPubKey"));
            CScript scriptPubKey(pkData.begin(), pkData.end());

            {
                auto coin = coins.find(out);
                if (coin != coins.end() && !coin->second.IsSpent() && coin->second.out.scriptPubKey != scriptPubKey) {
                    std::string err("Previous output scriptPubKey mismatch:\n");
                    err = err + ScriptToAsmStr(coin->second.out.scriptPubKey) + "\nvs:\n"+
                        ScriptToAsmStr(scriptPubKey);
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR, err);
                }
                Coin newcoin;
                newcoin.out.scriptPubKey = scriptPubKey;
                newcoin.out.nValue = MAX_MONEY;
                if (prevOut.exists("amount")) {
                    newcoin.out.nValue = AmountFromValue(prevOut.find_value("amount"));
                }
                newcoin.nHeight = 1;
                coins[out] = std::move(newcoin);
            }

            // if redeemScript and private keys were given, add redeemScript to the keystore so it can be signed
            const bool is_p2sh = scriptPubKey.IsPayToScriptHash();
            const bool is_p2wsh = scriptPubKey.IsPayToWitnessScriptHash();
            if (keystore && (is_p2sh || is_p2wsh)) {
                RPCTypeCheckObj(prevOut,
                    {
                        {"redeemScript", UniValueType(UniValue::VSTR)},
                        {"witnessScript", UniValueType(UniValue::VSTR)},
                    }, true);
                const UniValue& rs{prevOut.find_value("redeemScript")};
                const UniValue& ws{prevOut.find_value("witnessScript")};
                if (rs.isNull() && ws.isNull()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "Missing redeemScript/witnessScript");
                }

                // work from witnessScript when possible
                std::vector<unsigned char> scriptData(!ws.isNull() ? ParseHexV(ws, "witnessScript") : ParseHexV(rs, "redeemScript"));
                CScript script(scriptData.begin(), scriptData.end());
                keystore->scripts.emplace(CScriptID(script), script);
                // Automatically also add the P2WSH wrapped version of the script (to deal with P2SH-P2WSH).
                // This is done for redeemScript only for compatibility, it is encouraged to use the explicit witnessScript field instead.
                CScript witness_output_script{GetScriptForDestination(WitnessV0ScriptHash(script))};
                keystore->scripts.emplace(CScriptID(witness_output_script), witness_output_script);

                if (!ws.isNull() && !rs.isNull()) {
                    // if both witnessScript and redeemScript are provided,
                    // they should either be the same (for backwards compat),
                    // or the redeemScript should be the encoded form of
                    // the witnessScript (ie, for p2sh-p2wsh)
                    if (ws.get_str() != rs.get_str()) {
                        std::vector<unsigned char> redeemScriptData(ParseHexV(rs, "redeemScript"));
                        CScript redeemScript(redeemScriptData.begin(), redeemScriptData.end());
                        if (redeemScript != witness_output_script) {
                            throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript does not correspond to witnessScript");
                        }
                    }
                }

                if (is_p2sh) {
                    const CTxDestination p2sh{ScriptHash(script)};
                    const CTxDestination p2sh_p2wsh{ScriptHash(witness_output_script)};
                    if (scriptPubKey == GetScriptForDestination(p2sh)) {
                        // traditional p2sh; arguably an error if
                        // we got here with rs.IsNull(), because
                        // that means the p2sh script was specified
                        // via witnessScript param, but for now
                        // we'll just quietly accept it
                    } else if (scriptPubKey == GetScriptForDestination(p2sh_p2wsh)) {
                        // p2wsh encoded as p2sh; ideally the witness
                        // script was specified in the witnessScript
                        // param, but also support specifying it via
                        // redeemScript param for backwards compat
                        // (in which case ws.IsNull() == true)
                    } else {
                        // otherwise, can't generate scriptPubKey from
                        // either script, so we got unusable parameters
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                } else if (is_p2wsh) {
                    // plain p2wsh; could throw an error if script
                    // was specified by redeemScript rather than
                    // witnessScript (ie, ws.IsNull() == true), but
                    // accept it for backwards compat
                    const CTxDestination p2wsh{WitnessV0ScriptHash(script)};
                    if (scriptPubKey != GetScriptForDestination(p2wsh)) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                }
            }
        }
    }
}